

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

void glfwGetMonitorContentScale(GLFWmonitor *handle,float *xscale,float *yscale)

{
  _GLFWmonitor *monitor;
  
  if (xscale != (float *)0x0) {
    *xscale = 0.0;
  }
  if (yscale != (float *)0x0) {
    *yscale = 0.0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (xscale != (float *)0x0) {
    *xscale = _glfw.x11.contentScaleX;
  }
  if (yscale != (float *)0x0) {
    *yscale = _glfw.x11.contentScaleY;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorContentScale(GLFWmonitor* handle,
                                        float* xscale, float* yscale)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xscale)
        *xscale = 0.f;
    if (yscale)
        *yscale = 0.f;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetMonitorContentScale(monitor, xscale, yscale);
}